

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

uint __thiscall
llvm::detail::IEEEFloat::convertToHexString
          (IEEEFloat *this,char *dst,uint hexDigits,bool upperCase,roundingMode rounding_mode)

{
  byte bVar1;
  undefined8 uVar2;
  char *pcVar3;
  byte *pbVar4;
  
  bVar1 = this->field_0x12;
  pbVar4 = (byte *)dst;
  if ((bVar1 & 8) != 0) {
    pbVar4 = (byte *)(dst + 1);
    *dst = '-';
    bVar1 = this->field_0x12;
  }
  switch(bVar1 & 7) {
  case 0:
    uVar2 = 0x7974696e69666e69;
    if (upperCase) {
      uVar2 = 0x5954494e49464e49;
    }
    *(undefined8 *)pbVar4 = uVar2;
    pbVar4 = pbVar4 + 8;
    break;
  case 1:
    pcVar3 = "nan";
    if (upperCase) {
      pcVar3 = "NAN";
    }
    pbVar4[2] = pcVar3[2];
    *(undefined2 *)pbVar4 = *(undefined2 *)pcVar3;
    pbVar4 = pbVar4 + 3;
    break;
  case 2:
    pbVar4 = (byte *)convertNormalToHexString(this,(char *)pbVar4,hexDigits,upperCase,rounding_mode)
    ;
    break;
  case 3:
    *pbVar4 = 0x30;
    pbVar4[1] = !upperCase * ' ' + 0x58;
    pbVar4[2] = 0x30;
    if (hexDigits < 2) {
      pbVar4 = pbVar4 + 3;
    }
    else {
      pbVar4[3] = 0x2e;
      memset(pbVar4 + 4,0x30,(ulong)(hexDigits - 1));
      pbVar4 = pbVar4 + (ulong)(hexDigits - 1) + 4;
    }
    *pbVar4 = !upperCase * ' ' | 0x50;
    pbVar4[1] = 0x30;
    pbVar4 = pbVar4 + 2;
  }
  *pbVar4 = 0;
  return (int)pbVar4 - (int)dst;
}

Assistant:

unsigned int IEEEFloat::convertToHexString(char *dst, unsigned int hexDigits,
                                           bool upperCase,
                                           roundingMode rounding_mode) const {
  char *p;

  p = dst;
  if (sign)
    *dst++ = '-';

  switch (category) {
  case fcInfinity:
    memcpy (dst, upperCase ? infinityU: infinityL, sizeof infinityU - 1);
    dst += sizeof infinityL - 1;
    break;

  case fcNaN:
    memcpy (dst, upperCase ? NaNU: NaNL, sizeof NaNU - 1);
    dst += sizeof NaNU - 1;
    break;

  case fcZero:
    *dst++ = '0';
    *dst++ = upperCase ? 'X': 'x';
    *dst++ = '0';
    if (hexDigits > 1) {
      *dst++ = '.';
      memset (dst, '0', hexDigits - 1);
      dst += hexDigits - 1;
    }
    *dst++ = upperCase ? 'P': 'p';
    *dst++ = '0';
    break;

  case fcNormal:
    dst = convertNormalToHexString (dst, hexDigits, upperCase, rounding_mode);
    break;
  }

  *dst = 0;

  return static_cast<unsigned int>(dst - p);
}